

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_staj_visitor<char>::advance_multi_dim(basic_staj_visitor<char> *this,error_code *ec)

{
  ulong uVar1;
  size_type sVar2;
  reference puVar3;
  long in_RDI;
  ser_context *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  semantic_tag tag;
  basic_json_visitor<char> *pbVar4;
  size_t in_stack_ffffffffffffff88;
  unsigned_long value;
  basic_json_visitor<char> *in_stack_ffffffffffffff90;
  span<const_unsigned_long,_18446744073709551615UL> local_48;
  basic_json_visitor<char> local_38;
  basic_json_visitor<char> local_30 [3];
  ser_context local_18 [3];
  
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  sVar2 = detail::span<const_unsigned_long,_18446744073709551615UL>::size
                    ((span<const_unsigned_long,_18446744073709551615UL> *)(in_RDI + 0x48));
  if (sVar2 != 0) {
    if (*(int *)(in_RDI + 0x28) == 2) {
      detail::span<const_unsigned_long,_18446744073709551615UL>::size
                ((span<const_unsigned_long,_18446744073709551615UL> *)(in_RDI + 0x48));
      local_18[0]._vptr_ser_context = (_func_int **)0x0;
      ser_context::ser_context(local_18);
      basic_json_visitor<char>::begin_array
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,tag,in_stack_ffffffffffffff78,
                 (error_code *)0x2b12e9);
      ser_context::~ser_context(local_18);
      *(undefined4 *)(in_RDI + 0x28) = 3;
    }
    else {
      uVar1 = *(ulong *)(in_RDI + 0x58);
      sVar2 = detail::span<const_unsigned_long,_18446744073709551615UL>::size
                        ((span<const_unsigned_long,_18446744073709551615UL> *)(in_RDI + 0x48));
      if (uVar1 < sVar2) {
        puVar3 = detail::span<const_unsigned_long,_18446744073709551615UL>::operator[]
                           ((span<const_unsigned_long,_18446744073709551615UL> *)(in_RDI + 0x48),
                            *(size_type *)(in_RDI + 0x58));
        value = *puVar3;
        local_30[0]._vptr_basic_json_visitor = (_func_int **)0x0;
        pbVar4 = local_30;
        ser_context::ser_context((ser_context *)pbVar4);
        basic_json_visitor<char>::uint64_value
                  (pbVar4,value,tag,in_stack_ffffffffffffff78,(error_code *)0x2b139b);
        ser_context::~ser_context((ser_context *)local_30);
        *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 1;
      }
      else {
        *(undefined4 *)(in_RDI + 0x28) = 0;
        local_38._vptr_basic_json_visitor = (_func_int **)0x0;
        pbVar4 = &local_38;
        ser_context::ser_context((ser_context *)pbVar4);
        basic_json_visitor<char>::end_array(pbVar4,in_stack_ffffffffffffff78,(error_code *)0x2b1412)
        ;
        ser_context::~ser_context((ser_context *)&local_38);
        detail::span<const_unsigned_long,_18446744073709551615UL>::span(&local_48);
        *(pointer *)(in_RDI + 0x48) = local_48.data_;
        *(size_type *)(in_RDI + 0x50) = local_48.size_;
        *(undefined8 *)(in_RDI + 0x58) = 0;
      }
    }
  }
  return;
}

Assistant:

void advance_multi_dim(std::error_code& ec)
    {
        if (shape_.size() != 0)
        {
            if (state_ == staj_cursor_state::multi_dim)
            {
                this->begin_array(shape_.size(), semantic_tag::none, ser_context(), ec);
                state_ = staj_cursor_state::shape;
            }
            else if (index_ < shape_.size())
            {
                this->uint64_value(shape_[index_], semantic_tag::none, ser_context(), ec);
                ++index_;
            }
            else
            {
                state_ = staj_cursor_state();
                this->end_array(ser_context(), ec);
                shape_ = jsoncons::span<const size_t>();
                index_ = 0;
            }
        }
    }